

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

tmbstr prvTidytidyNormalizedLocaleName(ctmbstr locale)

{
  int iVar1;
  tmbstr s;
  size_t sVar2;
  uint local_2c;
  char *local_28;
  tmbstr search;
  TidyAllocator *allocator;
  uint len;
  uint i;
  ctmbstr locale_local;
  
  s = prvTidytmbstrdup(&prvTidyg_default_allocator,locale);
  local_28 = prvTidytmbstrtolower(s);
  allocator._4_4_ = 0;
  while (localeMappings[allocator._4_4_].winName != (ctmbstr)0x0) {
    iVar1 = strcmp(localeMappings[allocator._4_4_].winName,local_28);
    if (iVar1 == 0) {
      (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,local_28);
      local_28 = prvTidytmbstrdup(&prvTidyg_default_allocator,
                                  localeMappings[allocator._4_4_].POSIXName);
      break;
    }
    allocator._4_4_ = allocator._4_4_ + 1;
  }
  sVar2 = strlen(local_28);
  local_2c = (uint)sVar2;
  if (5 < local_2c) {
    local_2c = 5;
  }
  allocator._4_4_ = 0;
  do {
    if (local_2c <= allocator._4_4_) {
LAB_0017310d:
      (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,local_28);
      return prvTidytidyNormalizedLocaleName::result;
    }
    if (allocator._4_4_ == 2) {
      if (local_2c != 5) {
        prvTidytidyNormalizedLocaleName::result[2] = '\0';
        goto LAB_0017310d;
      }
      prvTidytidyNormalizedLocaleName::result[2] = '_';
    }
    else {
      iVar1 = tolower((int)local_28[allocator._4_4_]);
      prvTidytidyNormalizedLocaleName::result[allocator._4_4_] = (char)iVar1;
    }
    allocator._4_4_ = allocator._4_4_ + 1;
  } while( true );
}

Assistant:

tmbstr TY_(tidyNormalizedLocaleName)( ctmbstr locale )
{
    uint i;
    uint len;
    static char result[6] = "xx_yy";
    TidyAllocator * allocator = &TY_(g_default_allocator);

    tmbstr search = TY_(tmbstrdup)( allocator, locale );
    search = TY_(tmbstrtolower)(search);
    
    /* See if our string matches a Windows name. */
    for (i = 0; localeMappings[i].winName; ++i)
    {
        if ( strcmp( localeMappings[i].winName, search ) == 0 )
        {
            TidyFree( allocator, search );
            search = TY_(tmbstrdup)( allocator, localeMappings[i].POSIXName );
            break;
        }
    }
    
    /* We're going to be stupid about this and trust the user, and
     return just the first two characters if they exist and the
     4th and 5th if they exist. The worst that can happen is a
     junk language that doesn't exist and won't be set. */
    
    len = strlen( search );
    len = ( len <= 5 ? len : 5 );
    
    for ( i = 0; i < len; i++ )
    {
        if ( i == 2 )
        {
            /* Either terminate the string or ensure there's an underscore */
            if (len == 5) {
                result[i] = '_';
            }
            else {
                result[i] = '\0';
                break;      /* no need to copy after null */
            }
        }
        else
        {
            result[i] = tolower( search[i] );
        }
    }
    
    TidyFree( allocator, search );
    return result;
}